

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O2

int Fra_OneHotRefineUsingCex(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  Aig_Man_t *pAVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj2;
  int iVar5;
  int Entry;
  int Entry_00;
  uint uVar6;
  int i;
  int local_4c;
  
  pAVar1 = p->pManAig;
  if (p->pSml->pAig == pAVar1) {
    iVar5 = pAVar1->nObjs[2] - pAVar1->nRegs;
    local_4c = 0;
    for (i = 0; i < vOneHots->nSize; i = i + 2) {
      uVar2 = Vec_IntEntry(vOneHots,i);
      uVar3 = Vec_IntEntry(vOneHots,i + 1);
      if (uVar2 != 0 || uVar3 != 0) {
        uVar6 = ~uVar2;
        if (0 < (int)uVar2) {
          uVar6 = uVar2 - 1;
        }
        pObj1 = Aig_ManCi(p->pManAig,uVar6 + iVar5);
        uVar6 = ~uVar3;
        if (0 < (int)uVar3) {
          uVar6 = uVar3 - 1;
        }
        pObj2 = Aig_ManCi(p->pManAig,uVar6 + iVar5);
        iVar4 = Fra_OneHotNodesAreClause(p->pSml,pObj1,pObj2,uVar2 >> 0x1f,uVar3 >> 0x1f);
        if (iVar4 == 0) {
          Vec_IntWriteEntry(vOneHots,i,Entry);
          Vec_IntWriteEntry(vOneHots,i + 1,Entry_00);
          local_4c = 1;
        }
      }
    }
    return local_4c;
  }
  __assert_fail("p->pSml->pAig == p->pManAig",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraHot.c"
                ,0x10f,"int Fra_OneHotRefineUsingCex(Fra_Man_t *, Vec_Int_t *)");
}

Assistant:

int Fra_OneHotRefineUsingCex( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i, Out1, Out2, RetValue = 0;
    int nPiNum = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    assert( p->pSml->pAig == p->pManAig );
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        // get the corresponding nodes
        pObj1 = Aig_ManCi( p->pManAig, nPiNum + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCi( p->pManAig, nPiNum + Fra_LitReg(Out2) );
        // check if implication holds using this simulation info
        if ( !Fra_OneHotNodesAreClause( p->pSml, pObj1, pObj2, Fra_LitSign(Out1), Fra_LitSign(Out2) ) )
        {
            Vec_IntWriteEntry( vOneHots, i, 0 );
            Vec_IntWriteEntry( vOneHots, i+1, 0 );
            RetValue = 1;
        }
    }
    return RetValue;
}